

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON__UINT8 __thiscall ON_SubDComponentPtr::SetMarkBits(ON_SubDComponentPtr *this,ON__UINT8 mark_bits)

{
  ON__UINT8 OVar1;
  ulong uVar2;
  
  uVar2 = this->m_ptr & 0xfffffffffffffff8;
  if (uVar2 == 0 || (this->m_ptr & 6) == 0) {
    return '\0';
  }
  OVar1 = ON_ComponentStatus::SetMarkBits((ON_ComponentStatus *)(uVar2 + 0x10),mark_bits);
  return OVar1;
}

Assistant:

class ON_SubDComponentBase* ON_SubDComponentPtr::ComponentBase() const
{
  switch ((ON_SUBD_COMPONENT_TYPE_MASK & m_ptr))
  {
  case ON_SUBD_COMPONENT_TYPE_VERTEX:
  case ON_SUBD_COMPONENT_TYPE_EDGE:
  case ON_SUBD_COMPONENT_TYPE_FACE:
    // During archive id mapping, the returned value can be an archive id and not a true pointer.
    // This is in a controlled setting inside functions like ON_SubDArchiveIdMap::ConvertArchiveIdToRuntimeSymmetrySetNextPtr().
    // All public level SDK code can safely assume the returned value is a true pointer.
    // It does mean that you cannot "validate" the value returned here
    // using some constraint on what you feel is a reasonable true pointer value.
    return ((class ON_SubDComponentBase*)ON_SUBD_COMPONENT_POINTER(m_ptr));
    break;
  }
  return nullptr;
}